

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::ForceFlushStateToDisk(Chainstate *this)

{
  long lVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  BlockValidationState state;
  FlushStateMode in_stack_000001dc;
  BlockValidationState *in_stack_000001e0;
  Chainstate *in_stack_000001e8;
  int in_stack_000002d4;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff48;
  LogFlags in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  ConstevalFormatString<2U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BlockValidationState::BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  uVar2 = FlushStateToDisk(in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,in_stack_000002d4);
  if (!(bool)uVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((ValidationState<BlockValidationResult> *)CONCAT17(uVar2,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff08 = 2;
    LogPrintFormatInternal<char[22],std::__cxx11::string>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,
               (Level)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,in_stack_ffffffffffffffb8,
               (char (*) [22])
               state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
               _M_allocated_capacity,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._8_8_);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  BlockValidationState::~BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::ForceFlushStateToDisk()
{
    BlockValidationState state;
    if (!this->FlushStateToDisk(state, FlushStateMode::ALWAYS)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}